

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls_preset_coding_parameters.h
# Opt level: O0

jpegls_pc_parameters *
charls::compute_default
          (jpegls_pc_parameters *__return_storage_ptr__,int32_t maximum_sample_value,
          int32_t near_lossless)

{
  bool bVar1;
  int iVar2;
  unsigned_short uVar3;
  int iVar4;
  int32_t iVar5;
  int *piVar6;
  int local_44 [3];
  int local_38;
  int32_t local_34;
  int local_30;
  int threshold2;
  int32_t local_28;
  int local_24;
  int threshold1;
  int32_t factor;
  int threshold2_1;
  int threshold1_1;
  int local_10;
  int32_t factor_1;
  int32_t near_lossless_local;
  int32_t maximum_sample_value_local;
  
  local_10 = near_lossless;
  factor_1 = maximum_sample_value;
  uVar3 = std::numeric_limits<unsigned_short>::max();
  iVar2 = local_10;
  if ((int)(uint)uVar3 < maximum_sample_value) {
    __assert_fail("maximum_sample_value <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                  ,0x18,"jpegls_pc_parameters charls::compute_default(const int32_t, const int32_t)"
                 );
  }
  bVar1 = false;
  if (-1 < local_10) {
    iVar4 = compute_maximum_near_lossless(factor_1);
    bVar1 = iVar2 <= iVar4;
  }
  if (!bVar1) {
    __assert_fail("near_lossless >= 0 && near_lossless <= compute_maximum_near_lossless(maximum_sample_value)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                  ,0x19,"jpegls_pc_parameters charls::compute_default(const int32_t, const int32_t)"
                 );
  }
  if (factor_1 < 0x80) {
    local_24 = (int)(0x100 / (long)(factor_1 + 1));
    threshold2 = 2;
    local_30 = (int)(3 / (long)local_24) + local_10 * 3;
    piVar6 = std::max<int>(&threshold2,&local_30);
    local_28 = clamp(*piVar6,local_10 + 1,factor_1);
    local_38 = 3;
    local_44[2] = (int)(7 / (long)local_24) + local_10 * 5;
    piVar6 = std::max<int>(&local_38,local_44 + 2);
    local_34 = clamp(*piVar6,local_28,factor_1);
    __return_storage_ptr__->maximum_sample_value = factor_1;
    __return_storage_ptr__->threshold1 = local_28;
    __return_storage_ptr__->threshold2 = local_34;
    local_44[1] = 4;
    local_44[0] = (int)(0x15 / (long)local_24) + local_10 * 7;
    piVar6 = std::max<int>(local_44 + 1,local_44);
    iVar5 = clamp(*piVar6,local_34,factor_1);
    __return_storage_ptr__->threshold3 = iVar5;
    __return_storage_ptr__->reset_value = 0x40;
  }
  else {
    threshold2_1 = 0xfff;
    piVar6 = std::min<int>(&factor_1,&threshold2_1);
    threshold1_1 = (*piVar6 + 0x80) / 0x100;
    factor = clamp(threshold1_1 + 2 + local_10 * 3,local_10 + 1,factor_1);
    threshold1 = clamp(threshold1_1 * 4 + 3 + local_10 * 5,factor,factor_1);
    __return_storage_ptr__->maximum_sample_value = factor_1;
    __return_storage_ptr__->threshold1 = factor;
    __return_storage_ptr__->threshold2 = threshold1;
    iVar5 = clamp(threshold1_1 * 0x11 + 4 + local_10 * 7,threshold1,factor_1);
    __return_storage_ptr__->threshold3 = iVar5;
    __return_storage_ptr__->reset_value = 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

inline jpegls_pc_parameters compute_default(const int32_t maximum_sample_value, const int32_t near_lossless) noexcept
{
    ASSERT(maximum_sample_value <= std::numeric_limits<uint16_t>::max());
    ASSERT(near_lossless >= 0 && near_lossless <= compute_maximum_near_lossless(maximum_sample_value));

    if (maximum_sample_value >= 128)
    {
        const int32_t factor{(std::min(maximum_sample_value, 4095) + 128) / 256};
        const int threshold1{
            clamp(factor * (default_threshold1 - 2) + 2 + 3 * near_lossless, near_lossless + 1, maximum_sample_value)};
        const int threshold2{
            clamp(factor * (default_threshold2 - 3) + 3 + 5 * near_lossless, threshold1, maximum_sample_value)};

        return {maximum_sample_value, threshold1, threshold2,
                clamp(factor * (default_threshold3 - 4) + 4 + 7 * near_lossless, threshold2, maximum_sample_value),
                default_reset_value};
    }

    const int32_t factor{256 / (maximum_sample_value + 1)};
    const int threshold1{
        clamp(std::max(2, default_threshold1 / factor + 3 * near_lossless), near_lossless + 1, maximum_sample_value)};
    const int threshold2{
        clamp(std::max(3, default_threshold2 / factor + 5 * near_lossless), threshold1, maximum_sample_value)};

    return {maximum_sample_value, threshold1, threshold2,
            clamp(std::max(4, default_threshold3 / factor + 7 * near_lossless), threshold2, maximum_sample_value),
            default_reset_value};
}